

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O3

int xmlValidateNmtokensValueInternal(xmlDocPtr doc,xmlChar *value)

{
  uint c;
  int iVar1;
  int iVar2;
  undefined8 in_RAX;
  xmlChar *cur;
  int len;
  undefined8 uStack_38;
  
  if (value == (xmlChar *)0x0) {
    iVar2 = 0;
  }
  else {
    iVar2 = 0;
    uStack_38 = in_RAX;
    c = xmlStringCurrentChar((xmlParserCtxtPtr)0x0,value,(int *)((long)&uStack_38 + 4));
    cur = value + uStack_38._4_4_;
    if ((int)c < 0x100) {
      do {
        if ((0x20 < c) || ((0x100002600U >> ((ulong)c & 0x3f) & 1) == 0)) break;
        c = xmlStringCurrentChar((xmlParserCtxtPtr)0x0,cur,(int *)((long)&uStack_38 + 4));
        cur = cur + uStack_38._4_4_;
      } while ((int)c < 0x100);
    }
    iVar1 = xmlIsDocNameChar(doc,c);
    if (iVar1 != 0) {
      iVar2 = xmlIsDocNameChar(doc,c);
      if (iVar2 != 0) {
        do {
          c = xmlStringCurrentChar((xmlParserCtxtPtr)0x0,cur,(int *)((long)&uStack_38 + 4));
          cur = cur + uStack_38._4_4_;
          iVar2 = xmlIsDocNameChar(doc,c);
        } while (iVar2 != 0);
      }
      iVar2 = 0;
      while (c == 0x20) {
        iVar1 = 0x20;
        while (iVar1 == 0x20) {
          iVar1 = xmlStringCurrentChar((xmlParserCtxtPtr)0x0,cur,(int *)((long)&uStack_38 + 4));
          cur = cur + uStack_38._4_4_;
        }
        if (iVar1 == 0) goto LAB_001953c6;
        iVar1 = xmlIsDocNameChar(doc,iVar1);
        if (iVar1 == 0) {
          return 0;
        }
        do {
          c = xmlStringCurrentChar((xmlParserCtxtPtr)0x0,cur,(int *)((long)&uStack_38 + 4));
          cur = cur + uStack_38._4_4_;
          iVar1 = xmlIsDocNameChar(doc,c);
        } while (iVar1 != 0);
      }
      if (c == 0) {
LAB_001953c6:
        iVar2 = 1;
      }
    }
  }
  return iVar2;
}

Assistant:

static int
xmlValidateNmtokensValueInternal(xmlDocPtr doc, const xmlChar *value) {
    const xmlChar *cur;
    int val, len;

    if (value == NULL) return(0);
    cur = value;
    val = xmlStringCurrentChar(NULL, cur, &len);
    cur += len;

    while (IS_BLANK(val)) {
	val = xmlStringCurrentChar(NULL, cur, &len);
	cur += len;
    }

    if (!xmlIsDocNameChar(doc, val))
	return(0);

    while (xmlIsDocNameChar(doc, val)) {
	val = xmlStringCurrentChar(NULL, cur, &len);
	cur += len;
    }

    /* Should not test IS_BLANK(val) here -- see erratum E20*/
    while (val == 0x20) {
	while (val == 0x20) {
	    val = xmlStringCurrentChar(NULL, cur, &len);
	    cur += len;
	}
	if (val == 0) return(1);

	if (!xmlIsDocNameChar(doc, val))
	    return(0);

	val = xmlStringCurrentChar(NULL, cur, &len);
	cur += len;

	while (xmlIsDocNameChar(doc, val)) {
	    val = xmlStringCurrentChar(NULL, cur, &len);
	    cur += len;
	}
    }

    if (val != 0) return(0);

    return(1);
}